

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_discovery_protocol.cpp
# Opt level: O2

bool udpdiscovery::impl::SerializeString
               (SerializeDirection direction,string *value,int value_size,BufferView *buffer_view)

{
  char cVar1;
  ulong uVar2;
  ulong uVar3;
  
  if (direction == kParse) {
    uVar3 = 0;
    if ((int)buffer_view->buffer_->_M_string_length < buffer_view->parsed_ + value_size)
    goto LAB_00105465;
    std::__cxx11::string::resize((ulong)value);
    uVar2 = (ulong)(uint)value_size;
    if (value_size < 1) {
      uVar2 = uVar3;
    }
    for (; uVar2 != uVar3; uVar3 = uVar3 + 1) {
      cVar1 = BufferView::Read(buffer_view);
      (value->_M_dataplus)._M_p[uVar3] = cVar1;
    }
  }
  else if (direction == kSerialize) {
    BufferView::InsertBack(buffer_view,value,value_size);
  }
  uVar3 = 1;
LAB_00105465:
  return SUB81(uVar3,0);
}

Assistant:

bool SerializeString(SerializeDirection direction, std::string* value,
                     int value_size, BufferView* buffer_view) {
  switch (direction) {
    case kSerialize:
      buffer_view->InsertBack(*value, value_size);
      break;

    case kParse:
      if (!buffer_view->CanRead(value_size)) {
        return false;
      }
      value->resize(value_size);
      for (int i = 0; i < (int)value_size; ++i) {
        (*value)[i] = buffer_view->Read();
      }
      break;
  }

  return true;
}